

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEncode(Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,CLzmaEncProps *props,
               Byte *propsEncoded,SizeT *propsSize,int writeEndMark,ICompressProgressPtr progress,
               ISzAllocPtr alloc,ISzAllocPtr allocBig)

{
  CLzmaEncHandle p_00;
  SRes local_4c;
  SRes res;
  CLzmaEncHandle p;
  Byte *propsEncoded_local;
  CLzmaEncProps *props_local;
  SizeT srcLen_local;
  Byte *src_local;
  SizeT *destLen_local;
  Byte *dest_local;
  
  p_00 = LzmaEnc_Create(alloc);
  if (p_00 == (CLzmaEncHandle)0x0) {
    dest_local._4_4_ = 2;
  }
  else {
    local_4c = LzmaEnc_SetProps(p_00,props);
    if ((local_4c == 0) &&
       (local_4c = LzmaEnc_WriteProperties(p_00,propsEncoded,propsSize), local_4c == 0)) {
      local_4c = LzmaEnc_MemEncode(p_00,dest,destLen,src,srcLen,writeEndMark,progress,alloc,allocBig
                                  );
    }
    LzmaEnc_Destroy(p_00,alloc,allocBig);
    dest_local._4_4_ = local_4c;
  }
  return dest_local._4_4_;
}

Assistant:

SRes LzmaEncode(Byte *dest, SizeT *destLen, const Byte *src, SizeT srcLen,
    const CLzmaEncProps *props, Byte *propsEncoded, SizeT *propsSize, int writeEndMark,
    ICompressProgressPtr progress, ISzAllocPtr alloc, ISzAllocPtr allocBig)
{
  CLzmaEncHandle p = LzmaEnc_Create(alloc);
  SRes res;
  if (!p)
    return SZ_ERROR_MEM;

  res = LzmaEnc_SetProps(p, props);
  if (res == SZ_OK)
  {
    res = LzmaEnc_WriteProperties(p, propsEncoded, propsSize);
    if (res == SZ_OK)
      res = LzmaEnc_MemEncode(p, dest, destLen, src, srcLen,
          writeEndMark, progress, alloc, allocBig);
  }

  LzmaEnc_Destroy(p, alloc, allocBig);
  return res;
}